

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * sx_strstr(char *str,char *find)

{
  char ch_00;
  code *pcVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int local_38;
  int len;
  int find_len;
  char *_start;
  char ch;
  char *find_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0x15b,"str");
    pcVar1 = (code *)swi(3);
    pcVar4 = (char *)(*pcVar1)();
    return pcVar4;
  }
  if (find != (char *)0x0) {
    ch_00 = *find;
    _len = sx_strchar(str,ch_00);
    iVar2 = sx_strlen(find);
    local_38 = sx_strlen(str);
    find_local = str;
    while( true ) {
      if (_len == (char *)0x0) {
        return (char *)0x0;
      }
      local_38 = local_38 - ((int)_len - (int)find_local);
      if (local_38 < iVar2) break;
      find_local = _len;
      iVar3 = memcmp(_len,find,(long)iVar2);
      if (iVar3 == 0) {
        return _len;
      }
      _len = sx_strchar(_len + 1,ch_00);
    }
    return (char *)0x0;
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                    0x15c,"find");
  pcVar1 = (code *)swi(3);
  pcVar4 = (char *)(*pcVar1)();
  return pcVar4;
}

Assistant:

const char* sx_strstr(const char* SX_RESTRICT str, const char* SX_RESTRICT find)
{
    sx_assert(str);
    sx_assert(find);

    char ch = find[0];
    const char* _start = sx_strchar(str, ch);
    int find_len = sx_strlen(find);
    int len = sx_strlen(str);

    while (_start) {
        // We have the first character, check the rest
        len -= (int)(intptr_t)(_start - str);
        if (len < find_len)
            return NULL;
        str = _start;

        if (sx_memcmp(_start, find, find_len) == 0)
            return str;

        _start = sx_strchar(_start + 1, ch);
    }

    return NULL;
}